

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O0

void __thiscall spvtools::opt::SSAPropagator::AddControlEdge(SSAPropagator *this,Edge *edge)

{
  BasicBlock *pBVar1;
  bool bVar2;
  CFG *this_00;
  BasicBlock *pBVar3;
  BasicBlock *local_20;
  BasicBlock *dest_bb;
  Edge *edge_local;
  SSAPropagator *this_local;
  
  pBVar1 = edge->dest;
  local_20 = pBVar1;
  dest_bb = (BasicBlock *)edge;
  edge_local = (Edge *)this;
  this_00 = IRContext::cfg(this->ctx_);
  pBVar3 = CFG::pseudo_exit_block(this_00);
  if ((pBVar1 != pBVar3) && (bVar2 = MarkEdgeExecutable(this,(Edge *)dest_bb), bVar2)) {
    std::
    queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
    ::push(&this->blocks_,&local_20);
  }
  return;
}

Assistant:

void SSAPropagator::AddControlEdge(const Edge& edge) {
  BasicBlock* dest_bb = edge.dest;

  // Refuse to add the exit block to the work list.
  if (dest_bb == ctx_->cfg()->pseudo_exit_block()) {
    return;
  }

  // Try to mark the edge executable.  If it was already in the set of
  // executable edges, do nothing.
  if (!MarkEdgeExecutable(edge)) {
    return;
  }

  // If the edge had not already been marked executable, add the destination
  // basic block to the work list.
  blocks_.push(dest_bb);
}